

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  BuiltIn BVar1;
  size_t sVar2;
  undefined4 uVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  ExecutionModel EVar7;
  SPIRExpression *pSVar8;
  SPIRType *pSVar9;
  long lVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string *psVar11;
  undefined8 uVar12;
  undefined7 uVar17;
  SPIRVariable *pSVar13;
  mapped_type *pmVar14;
  SPIRConstant *pSVar15;
  CompilerError *pCVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t uVar18;
  CompilerGLSL *pCVar19;
  ulong uVar20;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  uint id;
  ulong uVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar25;
  bool is_packed;
  bool access_chain_is_arrayed;
  uint32_t base_local;
  SPIRType *type;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  uint local_118;
  uint local_114;
  uint32_t physical_type;
  uint local_10c;
  uint local_108;
  allocator local_101;
  string local_100;
  string qual_mbr_name;
  BuiltIn builtin;
  AccessChainFlags flags_local;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  string local_a0;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_80;
  uint32_t *local_78;
  ulong local_70;
  anon_class_56_7_464c3a36 append_index;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_00000084,count);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  base_local = base;
  local_120 = flags;
  flags_local = flags;
  local_78 = indices;
  if ((flags & 2) == 0) {
    pSVar8 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,base);
    if (pSVar8 == (SPIRExpression *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = pSVar8->need_transpose;
      pSVar8->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_((string *)&append_index,this,base_local,(flags & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&append_index);
    ::std::__cxx11::string::~string((string *)&append_index);
    if (pSVar8 != (SPIRExpression *)0x0) {
      pSVar8->need_transpose = bVar4;
    }
  }
  uVar3 = local_120;
  local_124 = Compiler::expression_type_id(&this->super_Compiler,base_local);
  if ((this->backend).native_pointers == false) {
    if ((uVar3 & 4) != 0) {
      pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&append_index,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 (allocator *)&qual_mbr_name);
      CompilerError::CompilerError(pCVar16,(string *)&append_index);
      __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar4 = should_dereference(this,base_local);
    if (bVar4) {
      pSVar9 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_124);
      dereference_expression((string *)&append_index,this,pSVar9,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&append_index);
      ::std::__cxx11::string::~string((string *)&append_index);
    }
  }
  type = Compiler::get_pointee_type(&this->super_Compiler,local_124);
  lVar10 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  access_chain_is_arrayed = lVar10 != -1;
  local_118 = (*(this->super_Compiler)._vptr_Compiler[0x27])(this,(ulong)base_local);
  is_packed = Compiler::has_extended_decoration
                        (&this->super_Compiler,base_local,SPIRVCrossDecorationPhysicalTypePacked);
  physical_type =
       Compiler::get_extended_decoration
                 (&this->super_Compiler,base_local,SPIRVCrossDecorationPhysicalTypeID);
  bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)base_local,DecorationInvariant);
  local_108 = (uint)CONCAT71(extraout_var,bVar4);
  bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)base_local,DecorationRelaxedPrecision);
  local_10c = (uint)CONCAT71(extraout_var_00,bVar4);
  append_index.flags = &flags_local;
  append_index.base = &base_local;
  append_index.type = &type;
  append_index.access_chain_is_arrayed = &access_chain_is_arrayed;
  append_index.physical_type = &physical_type;
  local_ac = uVar3 & 0x11;
  local_80 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->super_Compiler).ir.meta;
  local_b0 = uVar3 & 0xff;
  uVar20 = 0;
  local_114 = 0;
  local_11c = 0;
  local_70 = (ulong)count;
  append_index.this = this;
  append_index.expr = __return_storage_ptr__;
  do {
    if (uVar20 == local_70) {
      if ((local_11c & 1) == 0) {
        if (meta != (AccessChainMeta *)0x0) {
          meta->need_transpose = (bool)((byte)local_118 & 1);
          meta->storage_is_packed = is_packed;
          meta->storage_is_invariant = (bool)((byte)local_108 & 1);
          meta->storage_physical_type = physical_type;
          meta->relaxed_precision = (bool)((byte)local_10c & 1);
        }
        return __return_storage_ptr__;
      }
      pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&qual_mbr_name,
                 "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
                 ,(allocator *)&local_100);
      CompilerError::CompilerError(pCVar16,&qual_mbr_name);
      __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar23 = local_78[uVar20];
    uVar22 = 0;
    if (-1 < (int)uVar23) {
      uVar22 = local_b0;
    }
    id = uVar23 & 0x7fffffff;
    if (local_ac != 0x11) {
      id = uVar23;
    }
    uVar24 = (ulong)id;
    if (local_ac != 0x11) {
      uVar22 = local_b0;
    }
    bVar21 = (byte)uVar22;
    local_a8 = uVar20;
    if (uVar20 == 0 && (local_120 & 4) != 0) {
      bVar5 = (this->options).flatten_multidimensional_arrays;
      if ((bool)bVar5 == true) {
        if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          local_114 = 0;
          local_11c = 0;
        }
        else {
          pSVar9 = type;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          bVar5 = (this->options).flatten_multidimensional_arrays;
          uVar17 = (undefined7)((ulong)pSVar9 >> 8);
          local_114 = (uint)CONCAT71(uVar17,1);
          local_11c = (undefined4)CONCAT71(uVar17,1);
        }
      }
      if (((bVar5 & 1) == 0) || ((local_114 & 1) == 0)) {
        access_chain_internal::anon_class_56_7_464c3a36::operator()
                  (&append_index,id,(bool)(bVar21 & 1),true);
      }
      else {
        if ((uVar22 & 1) == 0) {
          to_enclosed_expression_abi_cxx11_(&qual_mbr_name,this,id,(local_120 & 8) == 0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::to_string(&qual_mbr_name,id);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        uVar18 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
        while (uVar18 = uVar18 - 1, uVar18 != 0xffffffff) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          pCVar19 = this;
          to_array_size_abi_cxx11_(&local_100,this,type,uVar18);
          enclose_expression(&qual_mbr_name,pCVar19,&local_100);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&qual_mbr_name);
          ::std::__cxx11::string::~string((string *)&local_100);
        }
        if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          local_11c = 0;
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((local_11c & 1) != 0) goto LAB_0025300f;
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
LAB_0025300f:
      if (*(int *)&(type->super_IVariant).field_0xc == 0x15) {
        local_124 = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_124);
      }
LAB_002539f2:
      access_chain_is_arrayed = true;
    }
    else {
      sVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
      if (sVar2 != 0) {
        if (((this->options).flatten_multidimensional_arrays == true) && ((local_11c & 1) == 0)) {
          if (sVar2 == 1) {
            local_114 = 0;
            local_11c = 0;
          }
          else {
            uVar12 = ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar17 = (undefined7)((ulong)uVar12 >> 8);
            local_114 = (uint)CONCAT71(uVar17,1);
            local_11c = (undefined4)CONCAT71(uVar17,1);
          }
        }
        if ((type->parent_type).id == 0) {
          __assert_fail("type->parent_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x23c9,
                        "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                       );
        }
        pSVar13 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,base_local);
        if ((((local_a8 != 0) || (pSVar13 == (SPIRVariable *)0x0)) ||
            ((this->backend).force_gl_in_out_block == false)) ||
           ((bVar4 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar13), !bVar4 ||
            (bVar4 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                                DecorationBlock), bVar4)))) {
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_114 & 1) != 0)) {
            pSVar9 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->parent_type).id);
            if ((uVar22 & 1) == 0) {
              to_enclosed_expression_abi_cxx11_(&qual_mbr_name,this,id,(local_120 & 8) == 0);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              ::std::__cxx11::to_string(&qual_mbr_name,id);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            ::std::__cxx11::string::~string((string *)&qual_mbr_name);
            uVar18 = (uint32_t)(pSVar9->array).super_VectorView<unsigned_int>.buffer_size;
            while (uVar18 = uVar18 - 1, uVar18 != 0xffffffff) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              pCVar19 = this;
              to_array_size_abi_cxx11_(&local_100,this,pSVar9,uVar18);
              enclose_expression(&qual_mbr_name,pCVar19,&local_100);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&qual_mbr_name);
              ::std::__cxx11::string::~string((string *)&local_100);
            }
            if ((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              local_11c = 0;
            }
            else {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              if ((local_11c & 1) != 0) goto LAB_002539d6;
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            uVar18 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)base_local,DecorationBuiltIn);
            iVar6 = (*(this->super_Compiler)._vptr_Compiler[0x24])(this,(ulong)uVar18);
            if ((char)iVar6 == '\0') {
              access_chain_internal::anon_class_56_7_464c3a36::operator()
                        (&append_index,id,(bool)(bVar21 & 1),false);
            }
          }
        }
        else {
          qual_mbr_name._M_dataplus._M_p._0_4_ = base_local;
          pmVar14 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_80,(key_type *)&qual_mbr_name);
          BVar1 = (pmVar14->decoration).builtin_type;
          EVar7 = Compiler::get_execution_model(&this->super_Compiler);
          if (BVar1 < BuiltInTessLevelOuter) {
            if ((0x680U >> (BVar1 & BuiltInGlobalSize) & 1) != 0) goto LAB_002535da;
            if ((3U >> (BVar1 & BuiltInGlobalSize) & 1) == 0) goto LAB_002535c4;
            if (EVar7 == ExecutionModelMeshEXT) {
              to_expression_abi_cxx11_(&local_100,this,id,(local_120 & 8) == 0);
              ts_2 = __return_storage_ptr__;
              join<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (&qual_mbr_name,(spirv_cross *)"gl_MeshVerticesEXT[",
                         (char (*) [20])&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37f6c0,(char (*) [3])__return_storage_ptr__,ts_3);
            }
            else if (pSVar13->storage == StorageClassOutput) {
              to_expression_abi_cxx11_(&local_100,this,id,(local_120 & 8) == 0);
              ts_2 = __return_storage_ptr__;
              join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (&qual_mbr_name,(spirv_cross *)"gl_out[",(char (*) [8])&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37f6c0,(char (*) [3])__return_storage_ptr__,ts_3);
            }
            else {
              if (pSVar13->storage != StorageClassInput) goto LAB_002539bf;
              to_expression_abi_cxx11_(&local_100,this,id,(local_120 & 8) == 0);
              ts_2 = __return_storage_ptr__;
              join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                        (&qual_mbr_name,(spirv_cross *)"gl_in[",(char (*) [7])&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x37f6c0,(char (*) [3])__return_storage_ptr__,ts_3);
            }
LAB_00253623:
            ::std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&qual_mbr_name);
            ::std::__cxx11::string::~string((string *)&qual_mbr_name);
            ::std::__cxx11::string::~string((string *)&local_100);
          }
          else {
LAB_002535c4:
            if ((BVar1 == BuiltInPrimitiveShadingRateKHR) || (BVar1 == BuiltInCullPrimitiveEXT)) {
LAB_002535da:
              if (EVar7 == ExecutionModelMeshEXT) {
                to_expression_abi_cxx11_(&local_100,this,id,(local_120 & 8) == 0);
                ts_2 = __return_storage_ptr__;
                join<char_const(&)[22],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          (&qual_mbr_name,(spirv_cross *)"gl_MeshPrimitivesEXT[",
                           (char (*) [22])&local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x37f6c0,(char (*) [3])__return_storage_ptr__,ts_3);
                goto LAB_00253623;
              }
            }
LAB_002539bf:
            access_chain_internal::anon_class_56_7_464c3a36::operator()
                      (&append_index,id,(bool)(bVar21 & 1),false);
          }
        }
LAB_002539d6:
        local_124 = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_124);
        goto LAB_002539f2;
      }
      if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
        if ((uVar22 & 1) == 0) {
          uVar18 = Compiler::evaluate_constant_u32(&this->super_Compiler,id);
          uVar24 = (ulong)uVar18;
        }
        uVar23 = (uint)uVar24;
        if (uVar23 < (uint)(type->member_type_index_redirection).super_VectorView<unsigned_int>.
                           buffer_size) {
          uVar23 = (type->member_type_index_redirection).super_VectorView<unsigned_int>.ptr[uVar24];
        }
        pbVar25 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar23
        ;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size <= pbVar25) {
          pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&qual_mbr_name,"Member index is out of bounds!",
                     (allocator *)&local_100);
          CompilerError::CompilerError(pCVar16,&qual_mbr_name);
          __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        bVar4 = Compiler::is_member_builtin(&this->super_Compiler,type,uVar23,&builtin);
        if ((bVar4) &&
           (iVar6 = (*(this->super_Compiler)._vptr_Compiler[0x2b])(this,(ulong)base_local),
           (char)iVar6 != '\0')) {
          if (access_chain_is_arrayed == true) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            (*(this->super_Compiler)._vptr_Compiler[0x14])
                      (&qual_mbr_name,this,(ulong)builtin,(ulong)type->storage);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[0x14])
                      (&qual_mbr_name,this,(ulong)builtin,(ulong)type->storage);
            ::std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,(string *)&qual_mbr_name);
          }
        }
        else {
          psVar11 = Compiler::get_member_qualified_name_abi_cxx11_
                              (&this->super_Compiler,(TypeID)local_124,uVar23);
          ::std::__cxx11::string::string((string *)&qual_mbr_name,(string *)psVar11);
          if (qual_mbr_name._M_string_length == 0) {
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (ulong)(uint)local_120;
            if ((local_120 & 0x20) == 0) {
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)((local_120 & 4) >> 2);
              psVar11 = &local_100;
              ts_2 = pbVar25;
              (*(this->super_Compiler)._vptr_Compiler[0x2e])(psVar11,this,(ulong)base_local,type);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            else {
              ts_1 = pbVar25;
              to_member_name_abi_cxx11_(&local_a0,this,type,uVar23);
              join<char_const(&)[2],std::__cxx11::string>
                        (&local_100,(spirv_cross *)0x3835c0,(char (*) [2])&local_a0,ts_1);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&local_100);
              psVar11 = &local_a0;
            }
            ::std::__cxx11::string::~string((string *)psVar11);
          }
          else {
            ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        bVar4 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,uVar23,
                           DecorationInvariant);
        local_108 = local_108 & 0xff;
        if (bVar4) {
          local_108 = 1;
        }
        bVar4 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,uVar23,
                           DecorationRelaxedPrecision);
        local_10c = local_10c & 0xff;
        if (bVar4) {
          local_10c = 1;
        }
        is_packed = member_is_packed_physical_type(this,type,uVar23);
        bVar4 = member_is_remapped_physical_type(this,type,uVar23);
        uVar18 = 0;
        if (bVar4) {
          uVar18 = Compiler::get_extended_member_decoration
                             (&this->super_Compiler,(type->super_IVariant).self.id,uVar23,
                              SPIRVCrossDecorationPhysicalTypeID);
        }
        physical_type = uVar18;
        local_118 = (*(this->super_Compiler)._vptr_Compiler[0x28])(this,type,pbVar25);
        type = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,
                          (type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          [(long)pbVar25].id);
      }
      else if (type->columns < 2) {
        if (type->vecsize < 2) {
          if ((this->backend).allow_truncated_access_chain == false) {
            pCVar16 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&qual_mbr_name,"Cannot subdivide a scalar value!",
                       (allocator *)&local_100);
            CompilerError::CompilerError(pCVar16,&qual_mbr_name);
            __cxa_throw(pCVar16,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          qual_mbr_name._M_dataplus._M_p = (pointer)&qual_mbr_name.field_2;
          qual_mbr_name._M_string_length = 0;
          qual_mbr_name.field_2._M_local_buf[0] = '\0';
          if (((local_118 & 1) != 0) &&
             (lVar10 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b),
             lVar10 != -1)) {
            ::std::__cxx11::string::substr((ulong)&local_100,(ulong)__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)&qual_mbr_name,(string *)&local_100);
            ::std::__cxx11::string::~string((string *)&local_100);
            ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
          }
          bVar4 = true;
          local_124 = StorageClassGeneric;
          if ((flags_local & 0x40) == 0) {
            pSVar9 = Compiler::expression_type(&this->super_Compiler,base_local);
            local_124 = StorageClassGeneric;
            if (pSVar9->pointer == true) {
              local_124 = get_expression_effective_storage_class(this,base_local);
            }
            pSVar13 = Compiler::maybe_get_backing_variable(&this->super_Compiler,base_local);
            if (((pSVar13 == (SPIRVariable *)0x0) || (pSVar13->storage != StorageClassOutput)) ||
               (EVar7 = Compiler::get_execution_model(&this->super_Compiler),
               EVar7 != ExecutionModelTessellationControl)) {
              bVar4 = false;
            }
            else {
              bVar4 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                 DecorationPatch);
              bVar4 = !bVar4;
            }
            if ((!bVar4) && ((local_118 & 1) == 0)) {
              pSVar9 = Compiler::get<spirv_cross::SPIRType>
                                 (&this->super_Compiler,(type->parent_type).id);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (this->super_Compiler)._vptr_Compiler;
              ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is_packed
              ;
              (*(code *)ts_3[0xb]._M_string_length)(this,__return_storage_ptr__,pSVar9,local_124);
              bVar4 = false;
            }
          }
          if ((uVar22 & 1) == 0) {
            if (((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar24].
                 type == TypeConstant) && (((is_packed | (undefined1)local_118) & 1U) == 0)) {
              pSVar15 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,id);
              if (pSVar15->specialization == true) {
                if ((pSVar15->m).c[0].r[0].u32 < type->vecsize) {
                  to_expression_abi_cxx11_(&local_a0,this,id,true);
                }
                else {
                  ::std::__cxx11::string::string((string *)&local_a0,"0",&local_101);
                }
                join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                          (&local_100,(spirv_cross *)0x37d448,(char (*) [2])&local_a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x3759d6,(char (*) [2])ts_2);
                ::std::__cxx11::string::append((string *)__return_storage_ptr__);
                ::std::__cxx11::string::~string((string *)&local_100);
                ::std::__cxx11::string::~string((string *)&local_a0);
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              to_unpacked_expression_abi_cxx11_(&local_100,this,id,(local_120 & 8) == 0);
              ::std::__cxx11::string::append((string *)__return_storage_ptr__);
              ::std::__cxx11::string::~string((string *)&local_100);
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          else if (((is_packed | (undefined1)local_118) & 1U) == 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          else {
            if (type->vecsize <= id) {
              id = 0;
            }
            local_a0._M_dataplus._M_p._0_4_ = id;
            join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                      (&local_100,(spirv_cross *)0x37d448,(char (*) [2])&local_a0,(uint *)0x3759d6,
                       (char (*) [2])ts_2);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
            ::std::__cxx11::string::~string((string *)&local_100);
          }
          if (!bVar4 && (~(byte)local_118 & 1) == 0) {
            pSVar9 = Compiler::get<spirv_cross::SPIRType>
                               (&this->super_Compiler,(type->parent_type).id);
            ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this->super_Compiler)._vptr_Compiler;
            ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is_packed;
            (*(code *)ts_3[0xb]._M_string_length)(this,__return_storage_ptr__,pSVar9,local_124);
          }
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          physical_type = 0;
          is_packed = false;
          local_124 = (type->parent_type).id;
          type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_124);
          ::std::__cxx11::string::~string((string *)&qual_mbr_name);
          local_118 = 0;
        }
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if ((uVar22 & 1) == 0) {
          to_unpacked_expression_abi_cxx11_(&qual_mbr_name,this,id,(local_120 & 8) == 0);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::__cxx11::to_string(&qual_mbr_name,id);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&qual_mbr_name);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_124 = (type->parent_type).id;
        type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,local_124);
      }
    }
    uVar20 = local_a8 + 1;
  } while( true );
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool relaxed_precision = has_decoration(base, DecorationRelaxedPrecision);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal, bool is_ptr_chain = false) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		if (!is_ptr_chain)
			mod_flags &= ~ACCESS_CHAIN_PTR_CHAIN_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
		check_physical_type_cast(expr, type, physical_type);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal, true);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				// Similar concerns apply for mesh shaders where we have to redirect to gl_MeshVerticesEXT or MeshPrimitivesEXT.
				auto builtin = ir.meta[base].decoration.builtin_type;
				bool mesh_shader = get_execution_model() == ExecutionModelMeshEXT;

				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (mesh_shader)
						expr = join("gl_MeshVerticesEXT[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				case BuiltInPrimitiveId:
				case BuiltInLayer:
				case BuiltInViewportIndex:
				case BuiltInCullPrimitiveEXT:
				case BuiltInPrimitiveShadingRateKHR:
					if (mesh_shader)
						expr = join("gl_MeshPrimitivesEXT[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members, possibly through a redirection mapping.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index < uint32_t(type->member_type_index_redirection.size()))
				index = type->member_type_index_redirection[index];

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin) && access_chain_needs_stage_io_builtin_translation(base))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;
			if (has_member_decoration(type->self, index, DecorationRelaxedPrecision))
				relaxed_precision = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_unpacked_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage = StorageClassGeneric;
			bool ignore_potential_sliced_writes = false;
			if ((flags & ACCESS_CHAIN_FORCE_COMPOSITE_BIT) == 0)
			{
				if (expression_type(base).pointer)
					effective_storage = get_expression_effective_storage_class(base);

				// Special consideration for control points.
				// Control points can only be written by InvocationID, so there is no need
				// to consider scalar access chains here.
				// Cleans up some cases where it's very painful to determine the accurate storage class
				// since blocks can be partially masked ...
				auto *var = maybe_get_backing_variable(base);
				if (var && var->storage == StorageClassOutput &&
				    get_execution_model() == ExecutionModelTessellationControl &&
				    !has_decoration(var->self, DecorationPatch))
				{
					ignore_potential_sliced_writes = true;
				}
			}
			else
				ignore_potential_sliced_writes = true;

			if (!row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal)
			{
				bool out_of_bounds = (index >= type->vecsize);

				if (!is_packed && !row_major_matrix_needs_conversion)
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : index);
				}
				else
				{
					// For packed vectors, we can only access them as an array, not by swizzle.
					expr += join("[", out_of_bounds ? 0 : index, "]");
				}
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				bool out_of_bounds = (c.scalar() >= type->vecsize);

				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", out_of_bounds ? "0" : to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : c.scalar());
				}
			}
			else
			{
				expr += "[";
				expr += to_unpacked_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
		meta->relaxed_precision = relaxed_precision;
	}

	return expr;
}